

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

BGZF * bgzf_write_init(char *mode)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  BGZF *pBVar5;
  byte *pbVar6;
  char *pcVar7;
  void *pvVar8;
  z_stream *pzVar9;
  uint uVar10;
  uint uVar11;
  
  pBVar5 = (BGZF *)calloc(1,0x60);
  uVar2 = *(uint *)pBVar5;
  *(uint *)pBVar5 = uVar2 & 0xfffcffff | 0x10000;
  pbVar6 = (byte *)mode;
  do {
    bVar1 = *pbVar6;
    if (bVar1 == 0) break;
    pbVar6 = pbVar6 + 1;
  } while (9 < (byte)(bVar1 - 0x30));
  pcVar7 = strchr(mode,0x75);
  uVar10 = uVar2 & 0x9ffcffff;
  if ((pcVar7 == (char *)0x0) && (uVar11 = -(uint)(bVar1 == 0) | bVar1 - 0x30, uVar11 != 0xfffffffe)
     ) {
    *(uint *)pBVar5 = uVar10 | 0x20010000;
    pvVar8 = malloc(0x10000);
    pBVar5->uncompressed_block = pvVar8;
    pvVar8 = malloc(0x10000);
    pBVar5->compressed_block = pvVar8;
    uVar3 = 0xffffffff;
    if (-1 < (int)uVar11) {
      uVar3 = uVar11;
    }
    uVar10 = uVar10 | 0x3ff10000;
    if ((int)uVar11 < 10) {
      uVar10 = uVar2 & 0x800cffff | 0x20010000 | (uVar3 & 0x1ff) << 0x14;
    }
    *(uint *)pBVar5 = uVar10;
    pcVar7 = strchr(mode,0x67);
    if (pcVar7 != (char *)0x0) {
      *(uint *)pBVar5 = uVar10 | 0x80000000;
      pzVar9 = (z_stream *)calloc(1,0x70);
      pBVar5->gz_stream = pzVar9;
      pzVar9->zalloc = (alloc_func)0x0;
      pzVar9->zfree = (free_func)0x0;
      iVar4 = deflateInit2_(pzVar9,(int)(uVar10 << 3) >> 0x17,8,0x1f,8,0,"1.2.11",0x70);
      if (iVar4 != 0) {
        pBVar5 = (BGZF *)0x0;
      }
    }
  }
  else {
    *(uint *)pBVar5 = uVar10 | 0x10000;
  }
  return pBVar5;
}

Assistant:

static BGZF *bgzf_write_init(const char *mode)
{
    BGZF *fp;
    fp = (BGZF*)calloc(1, sizeof(BGZF));
    fp->is_write = 1;
    int compress_level = mode2level(mode);
    if ( compress_level==-2 )
    {
        fp->is_compressed = 0;
        return fp;
    }
    fp->is_compressed = 1;
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compress_level = compress_level < 0? Z_DEFAULT_COMPRESSION : compress_level; // Z_DEFAULT_COMPRESSION==-1
    if (fp->compress_level > 9) fp->compress_level = Z_DEFAULT_COMPRESSION;
    if ( strchr(mode,'g') )
    {
        // gzip output
        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*)calloc(1,sizeof(z_stream));
        fp->gz_stream->zalloc = NULL;
        fp->gz_stream->zfree  = NULL;
        if ( deflateInit2(fp->gz_stream, fp->compress_level, Z_DEFLATED, 15|16, 8, Z_DEFAULT_STRATEGY)!=Z_OK ) return NULL;
    }
    return fp;
}